

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

Vec_Int_t * Cec_ManSatSolveMiter(Gia_Man_t *pAig,Cec_ParSat_t *pPars,Vec_Str_t **pvStatus)

{
  int iVar1;
  abctime aVar2;
  Vec_Str_t *p;
  Vec_Int_t *vCexStore;
  Cec_ManSat_t *p_00;
  Bar_Progress_t *p_01;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  char *pString;
  uint uVar5;
  Vec_Int_t *vCex;
  int v;
  bool bVar6;
  int local_40;
  
  aVar2 = Abc_Clock();
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  p = Vec_StrAlloc(pAig->vCos->nSize - pAig->nRegs);
  vCexStore = Vec_IntAlloc(10000);
  p_00 = Cec_ManSatCreate(pAig,pPars);
  p_01 = Bar_ProgressStart(_stdout,pAig->vCos->nSize - pAig->nRegs);
  v = 0;
  while ((v < pAig->vCos->nSize && (pGVar3 = Gia_ManCo(pAig,v), pGVar3 != (Gia_Obj_t *)0x0))) {
    p_00->vCex->nSize = 0;
    Bar_ProgressUpdate(p_01,v,pString);
    uVar5 = (uint)*(undefined8 *)pGVar3;
    if ((~*(ulong *)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
      bVar6 = (uVar5 >> 0x1d & 1) != 0;
      if (bVar6) {
        Cec_ManSatAddToStore(vCexStore,p_00->vCex,v);
      }
      Vec_StrPush(p,!bVar6);
    }
    else {
      iVar1 = Cec_ManSatCheckNode(p_00,(Gia_Obj_t *)
                                       ((ulong)(uVar5 >> 0x1d & 1) ^
                                       (ulong)(pGVar3 + -(ulong)(uVar5 & 0x1fffffff))));
      Vec_StrPush(p,(char)iVar1);
      if (iVar1 != 1) {
        if (iVar1 == -1) {
          vCex = (Vec_Int_t *)0x0;
        }
        else {
          Cec_ManSavePattern(p_00,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),
                             (Gia_Obj_t *)0x0);
          vCex = p_00->vCex;
        }
        Cec_ManSatAddToStore(vCexStore,vCex,v);
      }
    }
    v = v + 1;
  }
  aVar4 = Abc_Clock();
  local_40 = (int)aVar2;
  p_00->timeTotal = (int)aVar4 - local_40;
  Bar_ProgressStop(p_01);
  Cec_ManSatStop(p_00);
  *pvStatus = p;
  return vCexStore;
}

Assistant:

Vec_Int_t * Cec_ManSatSolveMiter( Gia_Man_t * pAig, Cec_ParSat_t * pPars, Vec_Str_t ** pvStatus )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Int_t * vCexStore;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int i, status;
    abctime clk = Abc_Clock();
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    // create resulting data-structures
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    // perform solving
    p = Cec_ManSatCreate( pAig, pPars );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntClear( p->vCex );
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, p->vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            continue;
        }
        if ( status == 1 )
            continue;
        assert( status == 0 );
        // save the pattern
//        Gia_ManIncrementTravId( pAig );
//        Cec_ManSatSolveMiter_rec( p, pAig, Gia_ObjFanin0(pObj) );
        Cec_ManSavePattern( p, Gia_ObjFanin0(pObj), NULL );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
        Cec_ManSatAddToStore( vCexStore, p->vCex, i );
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
//    if ( pPars->fVerbose )
//        Cec_ManSatPrintStats( p );
    Cec_ManSatStop( p );
    *pvStatus = vStatus;
    return vCexStore;
}